

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEvaluator.cpp
# Opt level: O0

double __thiscall
simpleExpressionEvaluator::ExpressionEvaluator::_identifier(ExpressionEvaluator *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  string local_b0;
  string local_90;
  double local_70;
  double value;
  string local_38 [8];
  string variable;
  int j;
  ExpressionEvaluator *this_local;
  
  variable.field_2._12_4_ = 0;
  std::__cxx11::string::string(local_38);
  while (iVar2 = isalnum(this->_token), iVar2 != 0) {
    std::__cxx11::string::operator+=(local_38,(char)this->_token);
    variable.field_2._12_4_ = variable.field_2._12_4_ + 1;
    _getToken(this);
  }
  std::__cxx11::string::string((string *)&value,local_38);
  bVar1 = VariableTable::exists(&this->_variableTable,(string *)&value);
  std::__cxx11::string::~string((string *)&value);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\nVariable token : ");
    std::operator<<(poVar3,local_38);
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar3,"Enter its value : ");
    std::istream::operator>>((istream *)&std::cin,&local_70);
    std::istream::ignore();
    std::__cxx11::string::string((string *)&local_90,local_38);
    VariableTable::addVariable(&this->_variableTable,&local_90,local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::string((string *)&local_b0,local_38);
  dVar4 = VariableTable::getVariable(&this->_variableTable,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string(local_38);
  return dVar4;
}

Assistant:

double ExpressionEvaluator::_identifier()
{
	/* identifier -> alphabet { alphabet | digit } */

	int j = 0;
	string variable;

	while (isalnum(_token))
	{
		variable += _token;
		j++;
		_getToken();
	}
	if (!_variableTable.exists(variable))
	{
		double value;
		cout << "\nVariable token : " << variable;
		cout << endl << "Enter its value : ";
		cin >> value;
		cin.ignore();
		_variableTable.addVariable(variable, value);
	}
	return _variableTable.getVariable(variable);
}